

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x942kdf.c
# Opt level: O0

int x942kdf_set_ctx_params(void *vctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_LIB_CTX *ctx_00;
  OSSL_PARAM *pOVar2;
  OSSL_LIB_CTX *libctx;
  long in_RSI;
  OSSL_PARAM *in_RDI;
  size_t id;
  char *propq;
  OSSL_LIB_CTX *provctx;
  KDF_X942 *ctx;
  OSSL_PARAM *pq;
  OSSL_PARAM *p;
  OSSL_PARAM *in_stack_ffffffffffffffb8;
  OSSL_PARAM *pOVar3;
  PROV_DIGEST *in_stack_ffffffffffffffd8;
  int local_4;
  
  ctx_00 = ossl_prov_ctx_get0_libctx((PROV_CTX *)in_RDI->key);
  pOVar3 = (OSSL_PARAM *)0x0;
  if (in_RSI == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = ossl_prov_digest_load_from_params(in_stack_ffffffffffffffd8,in_RDI,ctx_00);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
      if (pOVar2 == (OSSL_PARAM *)0x0) {
        pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
      }
      if ((pOVar2 == (OSSL_PARAM *)0x0) ||
         (iVar1 = x942kdf_set_buffer((uchar **)ctx_00,(size_t *)pOVar3,in_stack_ffffffffffffffb8),
         iVar1 != 0)) {
        pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
        if ((pOVar2 == (OSSL_PARAM *)0x0) ||
           (iVar1 = x942kdf_set_buffer((uchar **)ctx_00,(size_t *)pOVar3,in_stack_ffffffffffffffb8),
           iVar1 != 0)) {
          pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
          if (pOVar2 == (OSSL_PARAM *)0x0) {
            pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
          }
          if ((pOVar2 == (OSSL_PARAM *)0x0) ||
             (iVar1 = x942kdf_set_buffer((uchar **)ctx_00,(size_t *)pOVar3,in_stack_ffffffffffffffb8
                                        ), iVar1 != 0)) {
            pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
            if ((pOVar2 == (OSSL_PARAM *)0x0) ||
               (iVar1 = x942kdf_set_buffer((uchar **)ctx_00,(size_t *)pOVar3,
                                           in_stack_ffffffffffffffb8), iVar1 != 0)) {
              pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
              if ((pOVar2 == (OSSL_PARAM *)0x0) ||
                 (iVar1 = OSSL_PARAM_get_int(pOVar3,(int *)in_stack_ffffffffffffffb8), iVar1 != 0))
              {
                pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
                if (pOVar2 != (OSSL_PARAM *)0x0) {
                  iVar1 = x942kdf_set_buffer((uchar **)ctx_00,(size_t *)pOVar3,
                                             in_stack_ffffffffffffffb8);
                  if (iVar1 == 0) {
                    return 0;
                  }
                  *(undefined4 *)&in_RDI[3].return_size = 0;
                }
                pOVar2 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
                if ((pOVar2 == (OSSL_PARAM *)0x0) ||
                   (iVar1 = x942kdf_set_buffer((uchar **)ctx_00,(size_t *)pOVar3,
                                               in_stack_ffffffffffffffb8), iVar1 != 0)) {
                  libctx = (OSSL_LIB_CTX *)
                           OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
                  if (libctx != (OSSL_LIB_CTX *)0x0) {
                    if (*(uint *)&(libctx->data).ctx != 4) {
                      return 0;
                    }
                    pOVar3 = OSSL_PARAM_locate_const(pOVar3,(char *)in_stack_ffffffffffffffb8);
                    iVar1 = find_alg_id(libctx,(char *)pOVar3,(char *)in_RDI,(size_t *)ctx_00);
                    if (iVar1 == 0) {
                      return 0;
                    }
                    in_RDI[3].data = kek_algs[(long)in_stack_ffffffffffffffb8].oid;
                    in_RDI[3].data_size = kek_algs[(long)in_stack_ffffffffffffffb8].oid_len;
                    *(size_t *)&in_RDI[3].data_type =
                         kek_algs[(long)in_stack_ffffffffffffffb8].keklen;
                  }
                  local_4 = 1;
                }
                else {
                  local_4 = 0;
                }
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
          else {
            local_4 = 0;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int x942kdf_set_ctx_params(void *vctx, const OSSL_PARAM params[])
{
    const OSSL_PARAM *p, *pq;
    KDF_X942 *ctx = vctx;
    OSSL_LIB_CTX *provctx = PROV_LIBCTX_OF(ctx->provctx);
    const char *propq = NULL;
    size_t id;

    if (params == NULL)
        return 1;
    if (!ossl_prov_digest_load_from_params(&ctx->digest, params, provctx))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_SECRET);
    if (p == NULL)
        p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_KEY);
    if (p != NULL && !x942kdf_set_buffer(&ctx->secret, &ctx->secret_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_X942_ACVPINFO);
    if (p != NULL
        && !x942kdf_set_buffer(&ctx->acvpinfo, &ctx->acvpinfo_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_X942_PARTYUINFO);
    if (p == NULL)
        p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_UKM);
    if (p != NULL
        && !x942kdf_set_buffer(&ctx->partyuinfo, &ctx->partyuinfo_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_X942_PARTYVINFO);
    if (p != NULL
        && !x942kdf_set_buffer(&ctx->partyvinfo, &ctx->partyvinfo_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_X942_USE_KEYBITS);
    if (p != NULL && !OSSL_PARAM_get_int(p, &ctx->use_keybits))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_X942_SUPP_PUBINFO);
    if (p != NULL) {
        if (!x942kdf_set_buffer(&ctx->supp_pubinfo, &ctx->supp_pubinfo_len, p))
            return 0;
        ctx->use_keybits = 0;
    }

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_X942_SUPP_PRIVINFO);
    if (p != NULL
        && !x942kdf_set_buffer(&ctx->supp_privinfo, &ctx->supp_privinfo_len, p))
        return 0;

    p = OSSL_PARAM_locate_const(params, OSSL_KDF_PARAM_CEK_ALG);
    if (p != NULL) {
        if (p->data_type != OSSL_PARAM_UTF8_STRING)
            return 0;
        pq = OSSL_PARAM_locate_const(params, OSSL_ALG_PARAM_PROPERTIES);
        /*
         * We already grab the properties during ossl_prov_digest_load_from_params()
         * so there is no need to check the validity again..
         */
        if (pq != NULL)
            propq = p->data;
        if (find_alg_id(provctx, p->data, propq, &id) == 0)
            return 0;
        ctx->cek_oid = kek_algs[id].oid;
        ctx->cek_oid_len = kek_algs[id].oid_len;
        ctx->dkm_len = kek_algs[id].keklen;
    }
    return 1;
}